

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O1

int get_one_and_zeros_padding(uchar *input,size_t input_len,size_t *data_len)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  bool bVar8;
  
  iVar1 = -0x6100;
  if (data_len != (size_t *)0x0 && input != (uchar *)0x0) {
    *data_len = 0;
    if (input_len == 0) {
      return -0x6200;
    }
    uVar2 = *data_len;
    uVar4 = input_len - 1;
    bVar3 = 0xff;
    bVar5 = 0;
    do {
      bVar6 = input[uVar4] != '\0' | bVar5;
      uVar7 = 0;
      if (bVar6 != bVar5) {
        uVar7 = uVar4;
      }
      uVar2 = uVar2 | uVar7;
      *data_len = uVar2;
      bVar3 = bVar3 & (bVar6 == bVar5 | input[uVar4]) + 0x80;
      bVar8 = uVar4 != 0;
      uVar4 = uVar4 - 1;
      bVar5 = bVar6;
    } while (bVar8);
    iVar1 = -0x6200;
    if (bVar3 == 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int get_one_and_zeros_padding( unsigned char *input, size_t input_len,
                                      size_t *data_len )
{
    size_t i;
    unsigned char done = 0, prev_done, bad;

    if( NULL == input || NULL == data_len )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    bad = 0xFF;
    *data_len = 0;
    for( i = input_len; i > 0; i-- )
    {
        prev_done = done;
        done |= ( input[i-1] != 0 );
        *data_len |= ( i - 1 ) * ( done != prev_done );
        bad &= ( input[i-1] ^ 0x80 ) | ( done == prev_done );
    }

    return( MBEDTLS_ERR_CIPHER_INVALID_PADDING * ( bad != 0 ) );

}